

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.h
# Opt level: O3

Ray * pbrt::SpawnRayTo(Ray *__return_storage_ptr__,Point3fi pFrom,Normal3f nFrom,Float time,
                      Point3fi pTo,Normal3f nTo)

{
  float fVar1;
  undefined8 uVar2;
  ulong uVar3;
  Point3fi PVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float *pfVar10;
  float *pfVar11;
  bool in_CF;
  bool bVar12;
  bool in_ZF;
  bool bVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  float local_c;
  undefined8 uStack_8;
  
  PVar4.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval> =
       pTo.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>;
  auVar35._4_60_ = nTo._12_60_;
  auVar35._0_4_ = nTo.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar34._8_56_ = nTo._8_56_;
  auVar34._0_8_ = nTo.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar32._4_60_ = nFrom._12_60_;
  auVar32._0_4_ = nFrom.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar39._8_56_ = nFrom._8_56_;
  auVar39._0_8_ = nFrom.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_4_ = pTo.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
  ;
  auVar37._4_4_ = pTo.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar15 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar30 = auVar39._0_16_;
  auVar28 = vmovshdup_avx(auVar30);
  auVar33 = auVar34._0_16_;
  auVar29 = vmovshdup_avx(auVar33);
  auVar16 = vaddss_avx512f(ZEXT416((uint)pFrom.super_Point3<pbrt::Interval>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low),
                           ZEXT416((uint)pFrom.super_Point3<pbrt::Interval>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high));
  auVar17 = vsubss_avx512f(ZEXT416((uint)pFrom.super_Point3<pbrt::Interval>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),
                           ZEXT416((uint)pFrom.super_Point3<pbrt::Interval>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low));
  auVar19 = vinsertps_avx512f(ZEXT416((uint)pFrom.super_Point3<pbrt::Interval>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low),
                              ZEXT416((uint)pFrom.super_Point3<pbrt::Interval>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10)
  ;
  auVar20._8_8_ = 0;
  auVar20._0_4_ =
       pFrom.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar20._4_4_ =
       pFrom.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar18 = vsubss_avx512f(auVar20,ZEXT416((uint)pFrom.super_Point3<pbrt::Interval>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low));
  auVar21 = vinsertps_avx(ZEXT416((uint)pTo.super_Point3<pbrt::Interval>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low),
                          ZEXT416((uint)pTo.super_Point3<pbrt::Interval>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  auVar19 = vaddps_avx512vl(auVar20,auVar19);
  auVar23._8_8_ = 0;
  auVar23._0_4_ =
       pFrom.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar23._4_4_ =
       pFrom.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar20 = vmovshdup_avx512vl(auVar23);
  fVar14 = PVar4.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar22._0_4_ = fVar14 + auVar21._0_4_;
  auVar22._4_4_ =
       PVar4.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
       auVar21._4_4_;
  auVar22._8_4_ = auVar21._8_4_ + 0.0;
  auVar22._12_4_ = auVar21._12_4_ + 0.0;
  auVar21 = vsubss_avx512f(ZEXT416((uint)pFrom.super_Point3<pbrt::Interval>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),auVar20)
  ;
  auVar23 = SUB6416(ZEXT464(0x3f000000),0);
  auVar16 = vmulss_avx512f(auVar16,auVar23);
  auVar38._8_4_ = 0x7fffffff;
  auVar38._0_8_ = 0x7fffffff7fffffff;
  auVar38._12_4_ = 0x7fffffff;
  auVar17 = vmulss_avx512f(auVar17,auVar23);
  fVar36 = (pTo.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
           pTo.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5
  ;
  auVar18 = vmulss_avx512f(auVar18,auVar23);
  auVar20 = vmulps_avx512vl(auVar22,auVar15);
  auVar19 = vmulps_avx512vl(auVar19,auVar15);
  auVar21 = vmulss_avx512f(auVar21,auVar23);
  auVar15 = vsubss_avx512f(ZEXT416((uint)fVar36),auVar16);
  auVar22 = vsubps_avx512vl(auVar20,auVar19);
  auVar23 = vmovshdup_avx512vl(auVar22);
  auVar31 = auVar32._0_16_;
  auVar24 = vandps_avx512vl(auVar31,auVar38);
  auVar25 = vandps_avx512vl(auVar28,auVar38);
  auVar26 = vandps_avx512vl(auVar30,auVar38);
  auVar27 = vmulss_avx512f(auVar24,auVar17);
  auVar17 = vfmsub213ss_avx512f(auVar17,auVar24,auVar27);
  auVar21 = vfmadd213ss_avx512f(auVar21,auVar25,auVar27);
  auVar24 = vmulss_avx512f(auVar15,auVar31);
  auVar15 = vfmsub213ss_avx512f(auVar15,auVar31,auVar24);
  auVar28 = vfmadd213ss_avx512f(auVar23,auVar28,auVar24);
  auVar17 = vaddss_avx512f(auVar21,auVar17);
  vxorps_avx512vl(auVar21,auVar21);
  auVar21 = vfmadd231ss_avx512f(auVar17,auVar26,auVar18);
  auVar17 = vbroadcastss_avx512vl(auVar21);
  auVar18 = vmulss_avx512f(auVar21,auVar31);
  auVar21 = vaddss_avx512f(auVar28,auVar15);
  auVar15 = vmulps_avx512vl(auVar17,auVar30);
  auVar17._8_4_ = 0x80000000;
  auVar17._0_8_ = 0x8000000080000000;
  auVar17._12_4_ = 0x80000000;
  auVar28 = vfmadd231ss_avx512f(auVar21,auVar30,auVar22);
  auVar21 = vucomiss_avx512f(auVar28);
  auVar39 = ZEXT1664(auVar21);
  uVar2 = vcmpss_avx512f(auVar28,auVar21,1);
  bVar12 = (bool)((byte)uVar2 & 1);
  auVar21 = vxorps_avx512vl(auVar18,auVar17);
  auVar28._4_12_ = auVar18._4_12_;
  auVar28._0_4_ = (uint)bVar12 * auVar21._0_4_ + (uint)!bVar12 * auVar18._0_4_;
  if (!in_CF && !in_ZF) {
    auVar15 = vxorps_avx512vl(auVar15,auVar17);
  }
  auVar21 = vaddss_avx512f(auVar16,auVar28);
  auVar19 = vaddps_avx512vl(auVar19,auVar15);
  auVar16 = vmovshdup_avx512vl(auVar15);
  uVar6 = 0;
  uStack_8 = vmovlps_avx(auVar19);
  local_c = auVar21._0_4_;
  auVar32 = ZEXT464(0xff800000);
  do {
    vucomiss_avx512f(auVar39._0_16_);
    if (uVar6 < 2) {
      bVar12 = false;
      bVar13 = uVar6 == 0;
      auVar21 = auVar15;
      if (!bVar13) {
        bVar12 = uVar6 == 0;
        bVar13 = uVar6 == 1;
        auVar21 = auVar16;
        if (!bVar13) {
          auVar21 = auVar28;
        }
      }
      auVar21 = vucomiss_avx512f(auVar21);
      auVar39 = ZEXT1664(auVar21);
      if (!bVar12 && !bVar13) {
        bVar12 = false;
        pfVar10 = (float *)&uStack_8;
        if ((uVar6 != 0) &&
           (bVar12 = uVar6 == 0, pfVar10 = (float *)((long)&uStack_8 + 4), uVar6 != 1)) {
          pfVar10 = &local_c;
        }
        fVar8 = -INFINITY;
        auVar19 = vucomiss_avx512f(ZEXT416((uint)*pfVar10));
        auVar32 = ZEXT1664(auVar19);
        if (bVar12) {
          vcmpss_avx512f(ZEXT416((uint)*pfVar10),auVar21,0);
          auVar21 = vucomiss_avx512f(auVar21);
          fVar8 = (float)(auVar21._0_4_ + 1);
        }
        goto LAB_003e7763;
      }
    }
    else {
      fVar8 = INFINITY;
      vucomiss_avx512f(SUB6416(ZEXT464(0x7f800000),0));
LAB_003e7763:
      pfVar10 = (float *)&uStack_8;
      if ((uVar6 != 0) && (pfVar10 = (float *)((long)&uStack_8 + 4), uVar6 != 1)) {
        pfVar10 = &local_c;
      }
      *pfVar10 = fVar8;
    }
    uVar5 = uStack_8;
    fVar8 = local_c;
    uVar6 = uVar6 + 1;
  } while (uVar6 != 3);
  auVar28 = vmovshdup_avx(auVar37);
  auVar19 = vandps_avx512vl(auVar33,auVar38);
  auVar15 = vandps_avx512vl(auVar29,auVar38);
  auVar18 = auVar35._0_16_;
  auVar21 = vandps_avx(auVar38,auVar18);
  fVar1 = (pTo.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high -
          pTo.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low) * 0.5;
  auVar23 = ZEXT416((uint)local_c);
  auVar16 = vsubss_avx512f(auVar23,ZEXT416((uint)fVar36));
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uStack_8;
  auVar17 = vsubps_avx512vl(auVar24,auVar20);
  auVar22 = ZEXT416((uint)(auVar21._0_4_ * fVar1));
  auVar28 = vfmadd213ss_avx512f(ZEXT416((uint)((pTo.super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high -
                                               auVar28._0_4_) * 0.5)),auVar15,auVar22);
  auVar21 = vfmsub213ss_fma(ZEXT416((uint)fVar1),auVar21,auVar22);
  auVar15 = vmovshdup_avx512vl(auVar17);
  auVar21 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar28._0_4_ + auVar21._0_4_)),auVar19,
                                ZEXT416((uint)((fVar14 - pTo.super_Point3<pbrt::Interval>.
                                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                                                         x.low) * 0.5)));
  auVar28 = vmulss_avx512f(auVar16,auVar18);
  auVar29 = vfmadd213ss_avx512f(auVar15,auVar29,auVar28);
  auVar28 = vfmsub213ss_avx512f(auVar16,auVar18,auVar28);
  auVar19 = ZEXT816(0) << 0x20;
  fVar14 = auVar21._0_4_;
  auVar21 = vaddss_avx512f(auVar29,auVar28);
  auVar21 = vfmadd231ss_avx512f(auVar21,auVar17,auVar33);
  auVar29._0_4_ = fVar14 * nTo.super_Tuple3<pbrt::Normal3,_float>.x;
  auVar29._4_4_ = fVar14 * nTo.super_Tuple3<pbrt::Normal3,_float>.y;
  auVar29._8_4_ = fVar14 * nTo.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar29._12_4_ = fVar14 * nTo._12_4_;
  uVar2 = vcmpss_avx512f(auVar21,auVar19,1);
  bVar12 = (bool)((byte)uVar2 & 1);
  fVar14 = (float)((uint)bVar12 * (int)-(fVar14 * auVar35._0_4_) +
                  (uint)!bVar12 * (int)(fVar14 * auVar35._0_4_));
  if (auVar21._0_4_ < 0.0) {
    uVar3 = CONCAT44(auVar29._4_4_,auVar29._0_4_);
    auVar29._0_8_ = uVar3 ^ 0x8000000080000000;
    auVar29._8_4_ = -auVar29._8_4_;
    auVar29._12_4_ = -auVar29._12_4_;
  }
  fVar1 = auVar29._0_4_;
  auVar21._0_4_ = auVar20._0_4_ + fVar1;
  auVar21._4_4_ = auVar20._4_4_ + auVar29._4_4_;
  auVar21._8_4_ = auVar20._8_4_ + auVar29._8_4_;
  auVar21._12_4_ = auVar20._12_4_ + auVar29._12_4_;
  pfVar10 = (float *)((long)&uStack_8 + 4);
  iVar7 = 0;
  uStack_8 = vmovlps_avx(auVar21);
  auVar21 = vmovshdup_avx(auVar29);
  local_c = fVar36 + fVar14;
  do {
    fVar36 = fVar1;
    if ((iVar7 != 0) && (fVar36 = auVar21._0_4_, iVar7 != 1)) {
      fVar36 = fVar14;
    }
    if (fVar36 <= 0.0) {
      fVar36 = fVar1;
      if ((iVar7 != 0) && (fVar36 = auVar21._0_4_, iVar7 != 1)) {
        fVar36 = fVar14;
      }
      if (fVar36 < 0.0) {
        pfVar11 = (float *)&uStack_8;
        if ((iVar7 != 0) && (pfVar11 = pfVar10, iVar7 != 1)) {
          pfVar11 = &local_c;
        }
        fVar36 = *pfVar11;
        fVar9 = -INFINITY;
        if (auVar32._0_4_ < fVar36) {
          uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar36),auVar19,0);
          bVar12 = (bool)((byte)uVar2 & 1);
          fVar36 = (float)((uint)bVar12 * -0x80000000 + (uint)!bVar12 * (int)fVar36);
          fVar9 = (float)((int)fVar36 + -1 + (uint)(fVar36 <= 0.0) * 2);
        }
        goto LAB_003e792c;
      }
    }
    else {
      pfVar11 = (float *)&uStack_8;
      if ((iVar7 != 0) && (pfVar11 = pfVar10, iVar7 != 1)) {
        pfVar11 = &local_c;
      }
      fVar36 = *pfVar11;
      fVar9 = INFINITY;
      if (fVar36 < INFINITY) {
        uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar36),auVar19,0);
        fVar36 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar36);
        fVar9 = (float)((-(uint)(fVar36 < 0.0) | 1) + (int)fVar36);
      }
LAB_003e792c:
      pfVar11 = (float *)&uStack_8;
      if ((iVar7 != 0) && (pfVar11 = pfVar10, iVar7 != 1)) {
        pfVar11 = &local_c;
      }
      *pfVar11 = fVar9;
    }
    iVar7 = iVar7 + 1;
    if (iVar7 == 3) {
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uStack_8;
      uVar2 = vmovlps_avx512f(auVar24);
      (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
      (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar2 >> 0x20);
      (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.z = fVar8;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar5;
      auVar21 = vsubps_avx512vl(auVar19,auVar15);
      auVar28 = vsubss_avx512f(ZEXT416((uint)local_c),auVar23);
      uVar2 = vmovlps_avx(auVar21);
      (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
      (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar2 >> 0x20);
      (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.z = auVar28._0_4_;
      __return_storage_ptr__->time = time;
      (__return_storage_ptr__->medium).
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = 0;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

PBRT_CPU_GPU inline Ray SpawnRayTo(Point3fi pFrom, Normal3f nFrom, Float time,
                                   Point3fi pTo, Normal3f nTo) {
    Point3f pf = OffsetRayOrigin(pFrom, nFrom, Point3f(pTo) - Point3f(pFrom));
    Point3f pt = OffsetRayOrigin(pTo, nTo, pf - Point3f(pTo));
    return Ray(pf, pt - pf, time);
}